

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_chainstatemanager_tests.cpp
# Opt level: O2

void __thiscall
validation_chainstatemanager_tests::chainstatemanager_snapshot_completion_hash_mismatch::test_method
          (chainstatemanager_snapshot_completion_hash_mismatch *this)

{
  FastRandomContext *this_00;
  long lVar1;
  _Head_base<0UL,_Chainstate_*,_false> _Var2;
  string message;
  MatchFn match;
  bool bVar3;
  byte bVar4;
  SnapshotCompletionResult SVar5;
  int iVar6;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar7;
  CCoinsViewCache *this_01;
  uint64_t uVar8;
  ChainstateManager *pCVar9;
  unit_test_log_t *puVar10;
  iterator pvVar11;
  iterator pvVar12;
  SnapshotCompletionResult *pSVar13;
  pointer ppCVar14;
  __uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_> *p_Var15;
  _Head_base<0UL,_CBlockPolicyEstimator_*,_false> _Var16;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  undefined4 uVar17;
  undefined4 uVar18;
  check_type cVar21;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *pUVar19;
  undefined4 *puVar20;
  undefined8 in_stack_fffffffffffffb48;
  undefined8 in_stack_fffffffffffffb50;
  TestChain100Setup *this_02;
  _Manager_type in_stack_fffffffffffffb68;
  _Invoker_type in_stack_fffffffffffffb70;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined4 local_3c4;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> all_chainstates;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  _Any_data local_228;
  code *local_218;
  code *local_210;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  SnapshotCompletionResult res;
  tuple<Chainstate_*,_Chainstate_*> chainstates;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock62;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock63;
  __uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_> _Stack_198;
  assertion_result local_190;
  __uniq_ptr_impl<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_> local_178;
  path local_170;
  string local_148 [32];
  path snapshot_invalid_dir;
  path local_d8;
  path snapshot_chainstate_dir;
  pointer local_88;
  size_type sStack_80;
  size_type local_78;
  byte abStack_70 [8];
  Coin badcoin;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  SnapshotTestSetup::SetupSnapshot((SnapshotTestSetup *)&chainstates);
  puVar7 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (&(this->super_SnapshotTestSetup).super_TestChain100Setup.super_TestingSetup.
                       super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
                      ,0x2c8,"test_method","m_node.chainman");
  pCVar9 = (puVar7->_M_t).
           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
           super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  ((this->super_SnapshotTestSetup).super_TestChain100Setup.super_TestingSetup.
   super_ChainTestingSetup.super_BasicTestingSetup.m_node.notifications._M_t.
   super___uniq_ptr_impl<node::KernelNotifications,_std::default_delete<node::KernelNotifications>_>
   ._M_t.
   super__Tuple_impl<0UL,_node::KernelNotifications_*,_std::default_delete<node::KernelNotifications>_>
   .super__Head_base<0UL,_node::KernelNotifications_*,_false>._M_head_impl)->
  m_shutdown_on_fatal_error = false;
  pvVar11 = (iterator)0x2cf;
  pvVar12 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&snapshot_invalid_dir,&cs_main,
             "::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
             ,0x2cf,false);
  this_01 = Chainstate::CoinsTip
                      (chainstates.super__Tuple_impl<0UL,_Chainstate_*,_Chainstate_*>.
                       super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&snapshot_invalid_dir);
  Coin::Coin(&badcoin);
  this_00 = &(this->super_SnapshotTestSetup).super_TestChain100Setup.super_TestingSetup.
             super_ChainTestingSetup.super_BasicTestingSetup.m_rng;
  uVar8 = RandomMixin<FastRandomContext>::randbits<32>
                    (&this_00->super_RandomMixin<FastRandomContext>);
  badcoin.out.nValue = uVar8 & 0xffffffff;
  badcoin._40_4_ = badcoin._40_4_ & 1 | 2;
  uVar8 = RandomMixin<FastRandomContext>::randbits(&this_00->super_RandomMixin<FastRandomContext>,6)
  ;
  snapshot_invalid_dir.super_path._M_pathname._M_dataplus._M_p =
       snapshot_invalid_dir.super_path._M_pathname._M_dataplus._M_p & 0xffffffffffffff00;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::assign
            (&badcoin.out.scriptPubKey.super_CScriptBase,(size_type)uVar8,
             (uchar *)&snapshot_invalid_dir);
  RandomMixin<FastRandomContext>::rand256
            ((uint256 *)&local_88,&this_00->super_RandomMixin<FastRandomContext>);
  snapshot_invalid_dir.super_path._M_pathname.field_2._M_allocated_capacity = local_78;
  snapshot_invalid_dir.super_path._M_pathname.field_2._8_1_ = abStack_70[0];
  snapshot_invalid_dir.super_path._M_pathname.field_2._9_1_ = abStack_70[1];
  snapshot_invalid_dir.super_path._M_pathname.field_2._10_1_ = abStack_70[2];
  snapshot_invalid_dir.super_path._M_pathname.field_2._11_1_ = abStack_70[3];
  snapshot_invalid_dir.super_path._M_pathname.field_2._12_1_ = abStack_70[4];
  snapshot_invalid_dir.super_path._M_pathname.field_2._13_1_ = abStack_70[5];
  snapshot_invalid_dir.super_path._M_pathname.field_2._14_1_ = abStack_70[6];
  snapshot_invalid_dir.super_path._M_pathname.field_2._15_1_ = abStack_70[7];
  snapshot_invalid_dir.super_path._M_pathname._M_dataplus._M_p = local_88;
  snapshot_invalid_dir.super_path._M_pathname._M_string_length = sStack_80;
  snapshot_invalid_dir.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl._0_4_ =
       0;
  CCoinsViewCache::AddCoin(this_01,(COutPoint *)&snapshot_invalid_dir,&badcoin,false);
  ArgsManager::GetDataDirNet((path *)&local_d8,&gArgs);
  fs::operator/(&snapshot_chainstate_dir,(path *)&local_d8,"chainstate_snapshot");
  std::filesystem::__cxx11::path::~path(&local_d8);
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = pvVar12;
  msg.m_begin = pvVar11;
  file.m_end = (iterator)0x2d8;
  file.m_begin = (iterator)&local_1e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1f0,msg);
  bVar3 = std::filesystem::exists(&snapshot_chainstate_dir.super_path);
  local_190.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar3;
  local_190.m_message.px = (element_type *)0x0;
  local_190.m_message.pn.pi_ = (sp_counted_base *)0x0;
  all_chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc74363;
  all_chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xc74386;
  snapshot_invalid_dir.super_path._M_pathname._M_string_length =
       snapshot_invalid_dir.super_path._M_pathname._M_string_length & 0xffffffffffffff00;
  snapshot_invalid_dir.super_path._M_pathname._M_dataplus._M_p = "<W\x1b";
  snapshot_invalid_dir.super_path._M_pathname.field_2._M_allocated_capacity =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_1f8 = "";
  uVar17 = 0;
  uVar18 = 0;
  snapshot_invalid_dir.super_path._M_pathname.field_2._8_8_ = &all_chainstates;
  boost::test_tools::tt_detail::report_assertion
            (&local_190,(lazy_ostream *)&snapshot_invalid_dir,1,0,WARN,_cVar21,(size_t)&local_200,
             0x2d8);
  boost::detail::shared_count::~shared_count((shared_count *)&local_190.m_message.pn);
  std::__cxx11::string::string<std::allocator<char>>
            (local_148,"failed to validate the -assumeutxo snapshot state",
             (allocator<char> *)&local_190);
  local_228._M_unused._M_object = (void *)0x0;
  local_228._8_8_ = 0;
  local_210 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
              ::_M_invoke;
  local_218 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
              ::_M_manager;
  message._M_dataplus._M_p._4_4_ = uVar18;
  message._M_dataplus._M_p._0_4_ = uVar17;
  message._M_string_length = (size_type)_cVar21;
  message.field_2._M_allocated_capacity = in_stack_fffffffffffffb48;
  message.field_2._8_8_ = in_stack_fffffffffffffb50;
  match.super__Function_base._M_functor._8_8_ =
       chainstates.super__Tuple_impl<0UL,_Chainstate_*,_Chainstate_*>.
       super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
  match.super__Function_base._M_functor._M_unused._M_object = pCVar9;
  match.super__Function_base._M_manager = in_stack_fffffffffffffb68;
  match._M_invoker = in_stack_fffffffffffffb70;
  DebugLogHelper::DebugLogHelper((DebugLogHelper *)&snapshot_invalid_dir,message,match);
  std::_Function_base::~_Function_base((_Function_base *)&local_228);
  std::__cxx11::string::~string(local_148);
  pvVar11 = (iterator)0x2dc;
  pvVar12 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_190,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
             ,0x2dc,false);
  SVar5 = ChainstateManager::MaybeCompleteSnapshotValidation(pCVar9);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&local_190);
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar12;
  msg_00.m_begin = pvVar11;
  file_00.m_end = (iterator)0x2dd;
  file_00.m_begin = (iterator)&local_238;
  res = SVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_248,
             msg_00);
  local_190.m_message.px = (element_type *)((ulong)local_190.m_message.px & 0xffffffffffffff00);
  local_190._0_8_ = &PTR__lazy_ostream_01139f30;
  local_190.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_178._M_t.
  super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>.
  super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl =
       (tuple<CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>)
       ((long)"\x05\x04\x03\x02\x01" + 5);
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_250 = "";
  all_chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(all_chainstates.
                         super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,4);
  pvVar11 = (iterator)0x2;
  pSVar13 = &res;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,SnapshotCompletionResult,SnapshotCompletionResult>
            ((__uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_> *)&local_190,&local_258,
             0x2dd,1,2,pSVar13,0xc7d7cb,&all_chainstates,"SnapshotCompletionResult::HASH_MISMATCH");
  DebugLogHelper::~DebugLogHelper((DebugLogHelper *)&snapshot_invalid_dir);
  ChainstateManager::GetAll(&all_chainstates,pCVar9);
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)pSVar13;
  msg_01.m_begin = pvVar11;
  file_01.m_end = (iterator)0x2e1;
  file_01.m_begin = (iterator)&local_280;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_290,
             msg_01);
  snapshot_invalid_dir.super_path._M_pathname._M_string_length =
       snapshot_invalid_dir.super_path._M_pathname._M_string_length & 0xffffffffffffff00;
  snapshot_invalid_dir.super_path._M_pathname._M_dataplus._M_p = "<W\x1b";
  snapshot_invalid_dir.super_path._M_pathname.field_2._M_allocated_capacity =
       (size_type)boost::unit_test::lazy_ostream::inst;
  snapshot_invalid_dir.super_path._M_pathname.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_298 = "";
  local_190._0_8_ =
       (long)all_chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl
             .super__Vector_impl_data._M_finish -
       (long)all_chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl
             .super__Vector_impl_data._M_start >> 3;
  pUVar19 = &criticalblock63;
  criticalblock63.super_unique_lock._M_device =
       (mutex_type *)CONCAT44(criticalblock63.super_unique_lock._M_device._4_4_,1);
  pvVar11 = (iterator)0x2;
  p_Var15 = (__uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_> *)&local_190;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&snapshot_invalid_dir,&local_2a0,0x2e1,1,2,
             (__uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_> *)&local_190,0xc7402e,
             pUVar19,"1");
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)p_Var15;
  msg_02.m_begin = pvVar11;
  file_02.m_end = (iterator)0x2e2;
  file_02.m_begin = (iterator)&local_2b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2c0,
             msg_02);
  snapshot_invalid_dir.super_path._M_pathname._M_string_length =
       snapshot_invalid_dir.super_path._M_pathname._M_string_length & 0xffffffffffffff00;
  snapshot_invalid_dir.super_path._M_pathname._M_dataplus._M_p = "<W\x1b";
  snapshot_invalid_dir.super_path._M_pathname.field_2._M_allocated_capacity =
       (size_type)boost::unit_test::lazy_ostream::inst;
  snapshot_invalid_dir.super_path._M_pathname.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2c8 = "";
  pvVar11 = (iterator)0x2;
  ppCVar14 = all_chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Chainstate*,Chainstate*>
            (&snapshot_invalid_dir,&local_2d0,0x2e2,1,2,
             all_chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl
             .super__Vector_impl_data._M_start,0xc742e4,
             (__uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_> *)&local_190,
             "&validation_chainstate");
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)ppCVar14;
  msg_03.m_begin = pvVar11;
  file_03.m_end = (iterator)0x2e3;
  file_03.m_begin = (iterator)&local_2e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2f0,
             msg_03);
  snapshot_invalid_dir.super_path._M_pathname._M_string_length =
       snapshot_invalid_dir.super_path._M_pathname._M_string_length & 0xffffffffffffff00;
  snapshot_invalid_dir.super_path._M_pathname._M_dataplus._M_p = "<W\x1b";
  snapshot_invalid_dir.super_path._M_pathname.field_2._M_allocated_capacity =
       (size_type)boost::unit_test::lazy_ostream::inst;
  snapshot_invalid_dir.super_path._M_pathname.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2f8 = "";
  local_190._0_8_ = ChainstateManager::ActiveChainstate(pCVar9);
  p_Var15 = (__uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_> *)&local_190;
  pvVar11 = (iterator)0x2;
  criticalblock63.super_unique_lock._M_device =
       (mutex_type *)
       chainstates.super__Tuple_impl<0UL,_Chainstate_*,_Chainstate_*>.
       super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Chainstate*,Chainstate*>
            (&snapshot_invalid_dir,&local_300,0x2e3,1,2,p_Var15,0xc74514,pUVar19,
             "&validation_chainstate");
  ArgsManager::GetDataDirNet((path *)&local_170,&gArgs);
  this_02 = (TestChain100Setup *)this;
  fs::operator/(&snapshot_invalid_dir,(path *)&local_170,"chainstate_snapshot_INVALID");
  std::filesystem::__cxx11::path::~path(&local_170);
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)p_Var15;
  msg_04.m_begin = pvVar11;
  file_04.m_end = (iterator)0x2e6;
  file_04.m_begin = (iterator)&local_310;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_320,
             msg_04);
  bVar3 = std::filesystem::exists(&snapshot_invalid_dir.super_path);
  criticalblock63.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock63.super_unique_lock._M_device._1_7_,bVar3);
  criticalblock63.super_unique_lock._M_owns = false;
  criticalblock63.super_unique_lock._9_7_ = 0;
  _Stack_198._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (tuple<AddrMan_*,_std::default_delete<AddrMan>_>)
       (_Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>)0x0;
  local_178._M_t.
  super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>.
  super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl =
       (tuple<CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>)&criticalblock62
  ;
  criticalblock62.super_unique_lock._M_device = (mutex_type *)0xc74341;
  criticalblock62.super_unique_lock._8_8_ = (long)"!fs::exists(snapshot_invalid_dir)" + 0x21;
  local_190.m_message.px = (element_type *)((ulong)local_190.m_message.px & 0xffffffffffffff00);
  local_190._0_8_ = &PTR__lazy_ostream_0113a070;
  local_190.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_330 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_328 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock63,(lazy_ostream *)&local_190,1,0,WARN,
             (check_type)pUVar19,(size_t)&local_330,0x2e6);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_198);
  pCVar9 = SnapshotTestSetup::SimulateNodeRestart(&this->super_SnapshotTestSetup);
  criticalblock63.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_1539918;
  criticalblock63.super_unique_lock._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
       + 0x7b;
  _Stack_198._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (tuple<AddrMan_*,_std::default_delete<AddrMan>_>)
       (_Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>)0x2ed;
  puVar10 = boost::unit_test::unit_test_log_t::operator<<
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                       (begin *)&criticalblock63);
  boost::unit_test::unit_test_log_t::operator()
            ((unit_test_log_t *)&criticalblock62,(log_level)puVar10);
  local_190.m_message.px = (element_type *)((ulong)local_190.m_message.px & 0xffffffffffffff00);
  local_190._0_8_ = &PTR__lazy_ostream_0113aed0;
  local_190.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_178._M_t.
  super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>.
  super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl =
       (tuple<CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>)
       (_Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>)
       0xc740bd;
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&criticalblock62,(lazy_ostream *)&local_190);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&criticalblock62);
  ChainTestingSetup::LoadVerifyActivateChainstate((ChainTestingSetup *)this_02);
  local_340 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar12;
  msg_05.m_begin = pvVar11;
  file_05.m_end = (iterator)0x2f3;
  file_05.m_begin = (iterator)&local_340;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_350,
             msg_05);
  bVar3 = std::filesystem::exists(&snapshot_invalid_dir.super_path);
  criticalblock63.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock63.super_unique_lock._M_device._1_7_,bVar3);
  criticalblock63.super_unique_lock._M_owns = false;
  criticalblock63.super_unique_lock._9_7_ = 0;
  _Stack_198._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (tuple<AddrMan_*,_std::default_delete<AddrMan>_>)
       (_Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>)0x0;
  criticalblock62.super_unique_lock._M_device = (mutex_type *)0xc74341;
  criticalblock62.super_unique_lock._8_8_ = (long)"!fs::exists(snapshot_invalid_dir)" + 0x21;
  local_190.m_message.px = (element_type *)((ulong)local_190.m_message.px & 0xffffffffffffff00);
  local_190._0_8_ = &PTR__lazy_ostream_0113a070;
  local_190.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_360 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_358 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  local_178._M_t.
  super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>.
  super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl =
       (tuple<CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>)
       (tuple<CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>)&criticalblock62
  ;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock63,(lazy_ostream *)&local_190,1,0,WARN,
             (check_type)pUVar19,(size_t)&local_360,0x2f3);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_198);
  local_370 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar12;
  msg_06.m_begin = pvVar11;
  file_06.m_end = (iterator)0x2f4;
  file_06.m_begin = (iterator)&local_370;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_380,
             msg_06);
  bVar3 = std::filesystem::exists(&snapshot_chainstate_dir.super_path);
  criticalblock63.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock63.super_unique_lock._M_device._1_7_,!bVar3);
  criticalblock63.super_unique_lock._M_owns = false;
  criticalblock63.super_unique_lock._9_7_ = 0;
  _Stack_198._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (tuple<AddrMan_*,_std::default_delete<AddrMan>_>)
       (_Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>)0x0;
  criticalblock62.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_153d38f;
  criticalblock62.super_unique_lock._8_8_ = (long)"!fs::exists(snapshot_chainstate_dir)" + 0x24;
  local_190.m_message.px = (element_type *)((ulong)local_190.m_message.px & 0xffffffffffffff00);
  local_190._0_8_ = &PTR__lazy_ostream_0113a070;
  local_190.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_390 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_388 = "";
  local_178._M_t.
  super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>.
  super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl =
       (tuple<CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>)
       (tuple<CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>)&criticalblock62
  ;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock63,(lazy_ostream *)&local_190,1,0,WARN,
             (check_type)pUVar19,(size_t)&local_390,0x2f4);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_198);
  pvVar11 = (iterator)0x2f7;
  pvVar12 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock62,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
             ,0x2f7,false);
  local_3a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar12;
  msg_07.m_begin = pvVar11;
  file_07.m_end = (iterator)0x2f8;
  file_07.m_begin = (iterator)&local_3a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_3b0,
             msg_07);
  local_190.m_message.px = (element_type *)((ulong)local_190.m_message.px & 0xffffffffffffff00);
  local_190._0_8_ = &PTR__lazy_ostream_01139f30;
  local_190.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_178._M_t.
  super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>.
  super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl =
       (tuple<CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>)
       ((long)"\x05\x04\x03\x02\x01" + 5);
  local_3c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_3b8 = "";
  ChainstateManager::GetAll
            ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&criticalblock63,pCVar9);
  local_3f8 = (char *)(criticalblock63.super_unique_lock._8_8_ -
                       (long)criticalblock63.super_unique_lock._M_device >> 3);
  puVar20 = &local_3c4;
  local_3c4 = 1;
  pvVar11 = (iterator)0x2;
  _Var16._M_head_impl = (CBlockPolicyEstimator *)&local_3f8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            ((__uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_> *)&local_190,&local_3c0,
             0x2f8,1,2,(CBlockPolicyEstimator *)&local_3f8,0xc74109,puVar20,"1");
  std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base
            ((_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_> *)&criticalblock63);
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = (iterator)_Var16._M_head_impl;
  msg_08.m_begin = pvVar11;
  file_08.m_end = (iterator)0x2f9;
  file_08.m_begin = (iterator)&local_3d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3e8,
             msg_08);
  bVar3 = ChainstateManager::IsSnapshotActive(pCVar9);
  criticalblock63.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock63.super_unique_lock._M_device._1_7_,!bVar3);
  criticalblock63.super_unique_lock._M_owns = false;
  criticalblock63.super_unique_lock._9_7_ = 0;
  _Stack_198._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (tuple<AddrMan_*,_std::default_delete<AddrMan>_>)
       (_Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>)0x0;
  local_3f8 = "!chainman_restarted.IsSnapshotActive()";
  local_3f0 = "";
  local_190.m_message.px = (element_type *)((ulong)local_190.m_message.px & 0xffffffffffffff00);
  local_190._0_8_ = &PTR__lazy_ostream_0113a070;
  local_190.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_400 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  local_178._M_t.
  super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>.
  super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl =
       (tuple<CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>)
       (tuple<CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>)&local_3f8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock63,(lazy_ostream *)&local_190,1,0,WARN,
             (check_type)puVar20,(size_t)&local_408,0x2f9);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_198);
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pvVar12;
  msg_09.m_begin = pvVar11;
  file_09.m_end = (iterator)0x2fa;
  file_09.m_begin = (iterator)&local_418;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_428,
             msg_09);
  bVar4 = 1;
  if (((pCVar9->m_snapshot_chainstate)._M_t.
       super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
       super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
       super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl != (Chainstate *)0x0) &&
     (_Var2._M_head_impl =
           (pCVar9->m_ibd_chainstate)._M_t.
           super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
           super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
           super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl,
     _Var2._M_head_impl != (Chainstate *)0x0)) {
    bVar4 = (_Var2._M_head_impl)->m_disabled ^ 1;
  }
  criticalblock63.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock63.super_unique_lock._M_device._1_7_,bVar4);
  criticalblock63.super_unique_lock._M_owns = false;
  criticalblock63.super_unique_lock._9_7_ = 0;
  _Stack_198._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (tuple<AddrMan_*,_std::default_delete<AddrMan>_>)
       (_Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>)0x0;
  local_3f8 = "!chainman_restarted.IsSnapshotValidated()";
  local_3f0 = "";
  local_190.m_message.px = (element_type *)((ulong)local_190.m_message.px & 0xffffffffffffff00);
  local_190._0_8_ = &PTR__lazy_ostream_0113a070;
  local_190.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_430 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  local_178._M_t.
  super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>.
  super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl =
       (tuple<CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>)
       (tuple<CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>)&local_3f8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock63,(lazy_ostream *)&local_190,1,0,WARN,
             (check_type)puVar20,(size_t)&local_438,0x2fa);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_198);
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = pvVar12;
  msg_10.m_begin = pvVar11;
  file_10.m_end = (iterator)0x2fb;
  file_10.m_begin = (iterator)&local_448;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_458,
             msg_10);
  local_190.m_message.px = (element_type *)((ulong)local_190.m_message.px & 0xffffffffffffff00);
  local_190._0_8_ = &PTR__lazy_ostream_01139f30;
  local_190.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_178._M_t.
  super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>.
  super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl =
       (tuple<CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>)
       ((long)"\x05\x04\x03\x02\x01" + 5);
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_460 = "";
  iVar6 = ChainstateManager::ActiveHeight(pCVar9);
  criticalblock63.super_unique_lock._M_device =
       (mutex_type *)CONCAT44(criticalblock63.super_unique_lock._M_device._4_4_,iVar6);
  local_3f8._0_4_ = 0xd2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            ((__uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_> *)&local_190,&local_468,
             0x2fb,1,2,&criticalblock63,0xc74197,(CBlockPolicyEstimator *)&local_3f8,"210");
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock62.super_unique_lock);
  criticalblock63.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_1539918;
  criticalblock63.super_unique_lock._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
       + 0x7b;
  _Stack_198._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (tuple<AddrMan_*,_std::default_delete<AddrMan>_>)
       (_Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>)0x2ff;
  puVar10 = boost::unit_test::unit_test_log_t::operator<<
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                       (begin *)&criticalblock63);
  boost::unit_test::unit_test_log_t::operator()
            ((unit_test_log_t *)&criticalblock62,(log_level)puVar10);
  local_190.m_message.px = (element_type *)((ulong)local_190.m_message.px & 0xffffffffffffff00);
  local_190._0_8_ = &PTR__lazy_ostream_0113af90;
  local_190.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_178._M_t.
  super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>.
  super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl =
       (tuple<CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>)
       (_Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>)
       0xc74432;
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&criticalblock62,(lazy_ostream *)&local_190);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&criticalblock62);
  TestChain100Setup::mineBlocks(this_02,10);
  pvVar11 = (iterator)0x302;
  pvVar12 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock63,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
             ,0x302,false);
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = pvVar12;
  msg_11.m_begin = pvVar11;
  file_11.m_end = (iterator)0x303;
  file_11.m_begin = (iterator)&local_478;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_488,
             msg_11);
  local_190.m_message.px = (element_type *)((ulong)local_190.m_message.px & 0xffffffffffffff00);
  local_190._0_8_ = &PTR__lazy_ostream_01139f30;
  local_190.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_178._M_t.
  super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>.
  super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl =
       (tuple<CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>)
       ((long)"\x05\x04\x03\x02\x01" + 5);
  iVar6 = ChainstateManager::ActiveHeight(pCVar9);
  criticalblock62.super_unique_lock._M_device =
       (mutex_type *)CONCAT44(criticalblock62.super_unique_lock._M_device._4_4_,iVar6);
  local_3f8 = (char *)CONCAT44(local_3f8._4_4_,0xdc);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            ((__uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_> *)&local_190,
             &stack0xfffffffffffffb68,0x303,1,2,&criticalblock62,0xc74197,&local_3f8,"220");
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock63.super_unique_lock);
  std::filesystem::__cxx11::path::~path(&snapshot_invalid_dir.super_path);
  std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base
            (&all_chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>);
  std::filesystem::__cxx11::path::~path(&snapshot_chainstate_dir.super_path);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&badcoin.out.scriptPubKey.super_CScriptBase);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(chainstatemanager_snapshot_completion_hash_mismatch, SnapshotTestSetup)
{
    auto chainstates = this->SetupSnapshot();
    Chainstate& validation_chainstate = *std::get<0>(chainstates);
    ChainstateManager& chainman = *Assert(m_node.chainman);
    SnapshotCompletionResult res;
    m_node.notifications->m_shutdown_on_fatal_error = false;

    // Test tampering with the IBD UTXO set with an extra coin to ensure it causes
    // snapshot completion to fail.
    CCoinsViewCache& ibd_coins = WITH_LOCK(::cs_main,
        return validation_chainstate.CoinsTip());
    Coin badcoin;
    badcoin.out.nValue = m_rng.rand32();
    badcoin.nHeight = 1;
    badcoin.out.scriptPubKey.assign(m_rng.randbits(6), 0);
    Txid txid = Txid::FromUint256(m_rng.rand256());
    ibd_coins.AddCoin(COutPoint(txid, 0), std::move(badcoin), false);

    fs::path snapshot_chainstate_dir = gArgs.GetDataDirNet() / "chainstate_snapshot";
    BOOST_CHECK(fs::exists(snapshot_chainstate_dir));

    {
        ASSERT_DEBUG_LOG("failed to validate the -assumeutxo snapshot state");
        res = WITH_LOCK(::cs_main, return chainman.MaybeCompleteSnapshotValidation());
        BOOST_CHECK_EQUAL(res, SnapshotCompletionResult::HASH_MISMATCH);
    }

    auto all_chainstates = chainman.GetAll();
    BOOST_CHECK_EQUAL(all_chainstates.size(), 1);
    BOOST_CHECK_EQUAL(all_chainstates[0], &validation_chainstate);
    BOOST_CHECK_EQUAL(&chainman.ActiveChainstate(), &validation_chainstate);

    fs::path snapshot_invalid_dir = gArgs.GetDataDirNet() / "chainstate_snapshot_INVALID";
    BOOST_CHECK(fs::exists(snapshot_invalid_dir));

    // Test that simulating a shutdown (resetting ChainstateManager) and then performing
    // chainstate reinitializing successfully loads only the fully-validated
    // chainstate data, and we end up with a single chainstate that is at tip.
    ChainstateManager& chainman_restarted = this->SimulateNodeRestart();

    BOOST_TEST_MESSAGE("Performing Load/Verify/Activate of chainstate");

    // This call reinitializes the chainstates, and should clean up the now unnecessary
    // background-validation leveldb contents.
    this->LoadVerifyActivateChainstate();

    BOOST_CHECK(fs::exists(snapshot_invalid_dir));
    BOOST_CHECK(!fs::exists(snapshot_chainstate_dir));

    {
        LOCK(::cs_main);
        BOOST_CHECK_EQUAL(chainman_restarted.GetAll().size(), 1);
        BOOST_CHECK(!chainman_restarted.IsSnapshotActive());
        BOOST_CHECK(!chainman_restarted.IsSnapshotValidated());
        BOOST_CHECK_EQUAL(chainman_restarted.ActiveHeight(), 210);
    }

    BOOST_TEST_MESSAGE(
        "Ensure we can mine blocks on top of the \"new\" IBD chainstate");
    mineBlocks(10);
    {
        LOCK(::cs_main);
        BOOST_CHECK_EQUAL(chainman_restarted.ActiveHeight(), 220);
    }
}